

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexStringLiteral(Lexer *this)

{
  span<char,_18446744073709551615UL> text;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  char cVar2;
  byte bVar3;
  uint8_t uVar4;
  bool bVar5;
  int iVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  Lexer *in_RDI;
  Token TVar7;
  int i;
  int unicodeLen_1;
  uint32_t unused;
  char *curr_1;
  DiagCode code;
  int unicodeLen;
  uint32_t unicodeChar;
  char *curr;
  uint32_t charCode;
  char c;
  size_t offset;
  bool sawUTF8Error;
  bool tripleQuoted;
  Diagnostic *in_stack_fffffffffffffef8;
  SmallVectorBase<char> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  Lexer *in_stack_ffffffffffffff18;
  Diagnostic *in_stack_ffffffffffffff20;
  DiagCode DVar8;
  int *in_stack_ffffffffffffff30;
  uint32_t *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  Lexer *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined4 local_78;
  undefined4 local_74;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  TokenKind kind;
  undefined4 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined2 in_stack_ffffffffffffffa6;
  byte local_48;
  
  bVar1 = false;
  cVar2 = peek(in_RDI);
  local_48 = in_stack_ffffffffffffffa4;
  if (cVar2 == '\"') {
    cVar2 = peek(in_RDI,1);
    DVar8 = SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0);
    local_48 = in_stack_ffffffffffffffa4;
    if (cVar2 == '\"') {
      if ((int)(in_RDI->options).languageVersion < 1) {
        currentOffset(in_RDI);
        in_stack_ffffffffffffff20 =
             addDiag(in_stack_ffffffffffffff18,DVar8,
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        slang::toString(Default);
        arg._M_str._0_4_ = in_stack_ffffffffffffff50;
        arg._M_len = (size_t)in_stack_ffffffffffffff48;
        arg._M_str._4_4_ = in_stack_ffffffffffffff54;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),arg);
        local_48 = in_stack_ffffffffffffffa4;
      }
      bVar1 = true;
      advance(in_RDI,2);
    }
  }
  SmallVectorBase<char>::clear(in_stack_ffffffffffffff00);
  do {
    while( true ) {
      currentOffset(in_RDI);
      cVar2 = peek(in_RDI);
      kind = (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30);
      if (cVar2 == '\\') break;
      if (cVar2 == '\"') {
        if (!bVar1) {
          advance(in_RDI);
          src = extraout_RDX_00;
          goto LAB_009f6aba;
        }
        cVar2 = peek(in_RDI,1);
        if (cVar2 == '\"') {
          cVar2 = peek(in_RDI,2);
          kind = (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30);
          if (cVar2 == '\"') {
            advance(in_RDI,3);
            src = extraout_RDX;
            goto LAB_009f6aba;
          }
        }
        advance(in_RDI);
        SmallVectorBase<char>::push_back
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
      else {
        bVar5 = isNewline(cVar2);
        kind = (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30);
        if ((bVar5) && (!bVar1)) {
          addDiag(in_stack_ffffffffffffff18,SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0),
                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          src = extraout_RDX_01;
          goto LAB_009f6aba;
        }
        if (cVar2 == '\0') {
          bVar5 = reallyAtEnd(in_RDI);
          kind = (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30);
          DVar8 = SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0);
          if (bVar5) {
            addDiag(in_stack_ffffffffffffff18,DVar8,
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            src = extraout_RDX_02;
LAB_009f6aba:
            SmallVectorBase<char>::copy
                      (&(in_RDI->stringBuffer).super_SmallVectorBase<char>,
                       (EVP_PKEY_CTX *)in_RDI->alloc,src);
            text._M_ptr._4_4_ = in_stack_ffffffffffffff0c;
            text._M_ptr._0_4_ = in_stack_ffffffffffffff08;
            text._M_extent._M_extent_value._0_4_ = in_stack_ffffffffffffff10;
            text._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffff14;
            toStringView(text);
            TVar7 = create<std::basic_string_view<char,std::char_traits<char>>>
                              ((Lexer *)CONCAT26(in_stack_ffffffffffffffa6,
                                                 CONCAT15(in_stack_ffffffffffffffa5,
                                                          CONCAT14(local_48,
                                                  in_stack_ffffffffffffffa0))),kind,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            return TVar7;
          }
          in_RDI->errorCount = in_RDI->errorCount + 1;
          addDiag(in_stack_ffffffffffffff18,DVar8,
                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          advance(in_RDI);
        }
        else {
          bVar5 = isASCII(cVar2);
          if (bVar5) {
            advance(in_RDI);
            SmallVectorBase<char>::push_back
                      (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
          }
          else {
            scanUTF8Char(in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
            for (in_stack_ffffffffffffff54 = 0; in_stack_ffffffffffffff54 < local_a8;
                in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
              SmallVectorBase<char>::push_back
                        (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
            }
          }
        }
      }
    }
    advance(in_RDI);
    cVar2 = peek(in_RDI);
    advance(in_RDI);
    in_stack_ffffffffffffff18 = (Lexer *)(ulong)((int)cVar2 - 10);
    switch(in_stack_ffffffffffffff18) {
    case (Lexer *)0x0:
      break;
    default:
      in_stack_ffffffffffffff98 = in_RDI->sourceBuffer + -1;
      in_RDI->sourceBuffer = in_stack_ffffffffffffff98;
      bVar5 = scanUTF8Char(in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47,
                           in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if ((bVar5) && (bVar5 = isPrintableUnicode(in_stack_ffffffffffffff14), bVar5)) {
        if (cVar2 == '%') {
          in_stack_ffffffffffffff00 = (SmallVectorBase<char> *)&slang::diag::NonstandardEscapeCode;
        }
        else {
          in_stack_ffffffffffffff00 = (SmallVectorBase<char> *)&slang::diag::UnknownEscapeCode;
        }
        local_78 = *(undefined4 *)&in_stack_ffffffffffffff00->data_;
        local_74 = local_78;
        in_stack_fffffffffffffef8 =
             addDiag(in_stack_ffffffffffffff18,SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0),
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,in_stack_ffffffffffffff98,(long)in_stack_ffffffffffffff90);
        arg_00._M_str._0_4_ = in_stack_ffffffffffffff50;
        arg_00._M_len = (size_t)in_stack_ffffffffffffff48;
        arg_00._M_str._4_4_ = in_stack_ffffffffffffff54;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   arg_00);
      }
      in_RDI->sourceBuffer = in_stack_ffffffffffffff98;
      break;
    case (Lexer *)0x3:
      consume((Lexer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
              (char)((ulong)in_stack_ffffffffffffff00 >> 0x38));
      break;
    case (Lexer *)0x18:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x26:
    case (Lexer *)0x27:
    case (Lexer *)0x28:
    case (Lexer *)0x29:
    case (Lexer *)0x2a:
    case (Lexer *)0x2b:
    case (Lexer *)0x2c:
    case (Lexer *)0x2d:
      bVar3 = getDigitValue(cVar2);
      cVar2 = peek(in_RDI);
      bVar5 = isOctalDigit(cVar2);
      if (bVar5) {
        advance(in_RDI);
        in_stack_ffffffffffffff14 = (uint)bVar3 << 3;
        bVar3 = getDigitValue(cVar2);
        iVar6 = in_stack_ffffffffffffff14 + bVar3;
        cVar2 = peek(in_RDI);
        bVar5 = isOctalDigit(cVar2);
        if (bVar5) {
          advance(in_RDI);
          in_stack_ffffffffffffff10 = iVar6 * 8;
          bVar3 = getDigitValue(cVar2);
          if (0xff < in_stack_ffffffffffffff10 + (uint)bVar3) {
            addDiag(in_stack_ffffffffffffff18,SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0),
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            break;
          }
        }
      }
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x52:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x57:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x5c:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x64:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x6a:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x6c:
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      break;
    case (Lexer *)0x6e:
      cVar2 = peek(in_RDI);
      bVar5 = isHexDigit(cVar2);
      if (bVar5) {
        advance(in_RDI);
        local_48 = getHexDigitValue(cVar2);
        cVar2 = peek(in_RDI);
        bVar5 = isHexDigit(cVar2);
        if (bVar5) {
          advance(in_RDI);
          in_stack_ffffffffffffff0c = (uint)local_48 << 4;
          uVar4 = getHexDigitValue(cVar2);
          local_48 = (char)in_stack_ffffffffffffff0c + uVar4;
        }
        SmallVectorBase<char>::push_back
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
      else {
        in_stack_ffffffffffffffa6 = 2;
        addDiag(in_stack_ffffffffffffff18,SUB84((ulong)in_stack_ffffffffffffff20 >> 0x20,0),
                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        in_stack_ffffffffffffffa5 = 0x78;
        SmallVectorBase<char>::push_back
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
    }
  } while( true );
}

Assistant:

Token Lexer::lexStringLiteral() {
    bool tripleQuoted = false;
    if (peek() == '"' && peek(1) == '"') {
        // New in v1800-2023: triple quoted string literals
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, currentOffset() - 1)
                << toString(options.languageVersion);
        }
        tripleQuoted = true;
        advance(2);
    }

    stringBuffer.clear();
    bool sawUTF8Error = false;
    while (true) {
        size_t offset = currentOffset();
        char c = peek();

        if (c == '\\') {
            advance();
            c = peek();
            advance();

            uint32_t charCode;
            switch (c) {
                    // clang-format off
                case 'n': stringBuffer.push_back('\n'); break;
                case 't': stringBuffer.push_back('\t'); break;
                case '\\': stringBuffer.push_back('\\'); break;
                case '"': stringBuffer.push_back('"'); break;
                case 'v': stringBuffer.push_back('\v'); break;
                case 'f': stringBuffer.push_back('\f'); break;
                case 'a': stringBuffer.push_back('\a'); break;
                case '\n': break;
                case '\r': consume('\n'); break;
                case '0': case '1': case '2': case '3':
                case '4': case '5': case '6': case '7':
                    // clang-format on
                    // octal character code
                    charCode = getDigitValue(c);
                    if (isOctalDigit(c = peek())) {
                        advance();
                        charCode = (charCode * 8) + getDigitValue(c);
                        if (isOctalDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 8) + getDigitValue(c);
                            if (charCode > 255) {
                                addDiag(diag::OctalEscapeCodeTooBig, offset);
                                break;
                            }
                        }
                    }
                    stringBuffer.push_back((char)charCode);
                    break;
                case 'x':
                    c = peek();
                    if (!isHexDigit(c)) {
                        addDiag(diag::InvalidHexEscapeCode, offset);
                        stringBuffer.push_back('x');
                    }
                    else {
                        advance();
                        charCode = getHexDigitValue(c);
                        if (isHexDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 16) + getHexDigitValue(c);
                        }
                        stringBuffer.push_back((char)charCode);
                    }
                    break;
                default: {
                    auto curr = --sourceBuffer;

                    uint32_t unicodeChar;
                    int unicodeLen;
                    if (scanUTF8Char(sawUTF8Error, &unicodeChar, unicodeLen)) {
                        if (isPrintableUnicode(unicodeChar)) {
                            // '\%' is not an actual escape code but other tools silently allow it
                            // and major UVM headers use it, so we'll issue a (fairly quiet) warning
                            // about it. Otherwise issue a louder warning (on by default).
                            DiagCode code = c == '%' ? diag::NonstandardEscapeCode
                                                     : diag::UnknownEscapeCode;
                            addDiag(code, offset) << std::string_view(curr, (size_t)unicodeLen);
                        }
                    }
                    else {
                        sawUTF8Error = true;
                    }

                    // Back up so that we handle this character as a normal char in the outer loop,
                    // regardless of whether it's valid or not.
                    sourceBuffer = curr;
                    break;
                }
            }
        }
        else if (c == '"') {
            if (tripleQuoted) {
                if (peek(1) == '"' && peek(2) == '"') {
                    advance(3);
                    break;
                }
                else {
                    advance();
                    stringBuffer.push_back(c);
                    sawUTF8Error = false;
                }
            }
            else {
                advance();
                break;
            }
        }
        else if (isNewline(c) && !tripleQuoted) {
            addDiag(diag::ExpectedClosingQuote, offset);
            break;
        }
        else if (c == '\0') {
            if (reallyAtEnd()) {
                addDiag(diag::ExpectedClosingQuote, offset);
                break;
            }

            // otherwise just error and ignore
            errorCount++;
            addDiag(diag::EmbeddedNull, offset);
            advance();
        }
        else if (isASCII(c)) {
            advance();
            stringBuffer.push_back(c);
            sawUTF8Error = false;
        }
        else {
            auto curr = sourceBuffer;

            uint32_t unused;
            int unicodeLen;
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error, &unused, unicodeLen);

            // Regardless of whether the character sequence was valid or not
            // we want to add the bytes to the string, to allow for cases where
            // the source is actually something like latin-1 encoded. Ignoring the
            // warning and carrying on will do the right thing for them.
            for (int i = 0; i < unicodeLen; i++)
                stringBuffer.push_back(curr[i]);
        }
    }

    return create(TokenKind::StringLiteral, toStringView(stringBuffer.copy(alloc)));
}